

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O2

void qt_painterpath_isect_line(QPointF *p1,QPointF *p2,QPointF *pos,int *winding)

{
  qreal qVar1;
  double p2_00;
  double dVar2;
  bool bVar3;
  int iVar4;
  double dVar5;
  qreal qVar6;
  double p1_00;
  double local_38;
  
  local_38 = p1->xp;
  p1_00 = p1->yp;
  qVar1 = p2->xp;
  p2_00 = p2->yp;
  dVar2 = pos->yp;
  bVar3 = qFuzzyCompare(p1_00,p2_00);
  if (!bVar3) {
    if (p1_00 <= p2_00) {
      iVar4 = 1;
      dVar5 = p2_00;
      qVar6 = qVar1;
    }
    else {
      iVar4 = -1;
      dVar5 = p1_00;
      qVar6 = local_38;
      p1_00 = p2_00;
      local_38 = qVar1;
    }
    if (((dVar2 < dVar5) && (p1_00 <= dVar2)) &&
       ((dVar2 - p1_00) * ((qVar6 - local_38) / (dVar5 - p1_00)) + local_38 <= pos->xp)) {
      *winding = *winding + iVar4;
    }
  }
  return;
}

Assistant:

static void qt_painterpath_isect_line(const QPointF &p1,
                                      const QPointF &p2,
                                      const QPointF &pos,
                                      int *winding)
{
    qreal x1 = p1.x();
    qreal y1 = p1.y();
    qreal x2 = p2.x();
    qreal y2 = p2.y();
    qreal y = pos.y();

    int dir = 1;

    if (qFuzzyCompare(y1, y2)) {
        // ignore horizontal lines according to scan conversion rule
        return;
    } else if (y2 < y1) {
        qreal x_tmp = x2; x2 = x1; x1 = x_tmp;
        qreal y_tmp = y2; y2 = y1; y1 = y_tmp;
        dir = -1;
    }

    if (y >= y1 && y < y2) {
        qreal x = x1 + ((x2 - x1) / (y2 - y1)) * (y - y1);

        // count up the winding number if we're
        if (x<=pos.x()) {
            (*winding) += dir;
        }
    }
}